

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall CDirectiveData::encodeFloat(CDirectiveData *this)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  int64_t local_88;
  int64_t num_3;
  int32_t local_74;
  int64_t iStack_70;
  int32_t num_2;
  int64_t num_1;
  int32_t local_5c;
  undefined4 local_58;
  int32_t num;
  undefined1 local_48 [8];
  ExpressionValue value;
  size_t i;
  CDirectiveData *this_local;
  
  std::vector<long,_std::allocator<long>_>::clear(&this->normalData);
  for (value.strValue._value.field_2._8_8_ = 0; uVar1 = value.strValue._value.field_2._8_8_,
      sVar3 = std::vector<Expression,_std::allocator<Expression>_>::size(&this->entries),
      (ulong)uVar1 < sVar3;
      value.strValue._value.field_2._8_8_ = value.strValue._value.field_2._8_8_ + 1) {
    this_00 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                        (&this->entries,value.strValue._value.field_2._8_8_);
    Expression::evaluate((ExpressionValue *)local_48,this_00);
    bVar2 = ExpressionValue::isValid((ExpressionValue *)local_48);
    if (bVar2) {
      bVar2 = ExpressionValue::isInt((ExpressionValue *)local_48);
      if ((bVar2) && (this->mode == Float)) {
        local_5c = getFloatBits((float)(long)value._0_8_);
        num_1 = (int64_t)local_5c;
        std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&num_1);
      }
      else {
        bVar2 = ExpressionValue::isInt((ExpressionValue *)local_48);
        if ((bVar2) && (this->mode == Double)) {
          iStack_70 = getDoubleBits((double)(long)value._0_8_);
          std::vector<long,_std::allocator<long>_>::push_back
                    (&this->normalData,&stack0xffffffffffffff90);
        }
        else {
          bVar2 = ExpressionValue::isFloat((ExpressionValue *)local_48);
          if ((bVar2) && (this->mode == Float)) {
            local_74 = getFloatBits((float)(double)value._0_8_);
            num_3 = (int64_t)local_74;
            std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&num_3);
          }
          else {
            bVar2 = ExpressionValue::isFloat((ExpressionValue *)local_48);
            if ((bVar2) && (this->mode == Double)) {
              local_88 = getDoubleBits((double)value._0_8_);
              std::vector<long,_std::allocator<long>_>::push_back(&this->normalData,&local_88);
            }
            else {
              Logger::queueError<>(Error,"Invalid expression type");
            }
          }
        }
      }
      local_58 = 0;
    }
    else {
      Logger::queueError<>(Error,"Invalid expression");
      local_58 = 4;
    }
    ExpressionValue::~ExpressionValue((ExpressionValue *)local_48);
  }
  return;
}

Assistant:

void CDirectiveData::encodeFloat()
{
	normalData.clear();
	for (size_t i = 0; i < entries.size(); i++)
	{
		ExpressionValue value = entries[i].evaluate();
		if (!value.isValid())
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			continue;
		}

		if (value.isInt() && mode == EncodingMode::Float)
		{
			int32_t num = getFloatBits((float)value.intValue);
			normalData.push_back(num);
		} else if (value.isInt() && mode == EncodingMode::Double)
		{
			int64_t num = getDoubleBits((double)value.intValue);
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::Float)
		{
			int32_t num = getFloatBits((float)value.floatValue);
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::Double)
		{
			int64_t num = getDoubleBits((double)value.floatValue);
			normalData.push_back(num);
		} else {
			Logger::queueError(Logger::Error, "Invalid expression type");
		}
	}
}